

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O3

XMLElement * CGL::Collada::ColladaParser::get_element(XMLElement *xml,string *query)

{
  istream *piVar1;
  char *pcVar2;
  size_t sVar3;
  string id;
  string token;
  stringstream ss;
  undefined1 *local_208;
  long local_200;
  undefined1 local_1f8 [16];
  string local_1e8;
  char *local_1c8;
  undefined8 local_1c0;
  char local_1b8 [16];
  stringstream local_1a8 [128];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8,(string *)query,_S_out|_S_in);
  local_1c0 = 0;
  local_1b8[0] = '\0';
  local_1c8 = local_1b8;
  do {
    if (xml == (XMLElement *)0x0) {
      xml = (XMLElement *)0x0;
LAB_00110e5f:
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      std::__cxx11::stringstream::~stringstream(local_1a8);
      std::ios_base::~ios_base(local_128);
      return xml;
    }
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)&local_1c8,'/');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      pcVar2 = tinyxml2::XMLElement::Attribute(xml,"url",(char *)0x0);
      if (pcVar2 != (char *)0x0) {
        local_208 = local_1f8;
        sVar3 = strlen(pcVar2 + 1);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_208,pcVar2 + 1,pcVar2 + sVar3 + 1);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,local_208,local_208 + local_200);
        xml = uri_find(&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        if (local_208 != local_1f8) {
          operator_delete(local_208);
        }
      }
      goto LAB_00110e5f;
    }
    xml = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,local_1c8);
  } while( true );
}

Assistant:

XMLElement* ColladaParser::get_element( XMLElement* xml, string query ) {

  stringstream ss (query);

  // find xml element
  XMLElement* e = xml; string token;
  while( e && getline(ss, token, '/') ) {
    e = e->FirstChildElement( token.c_str() );
  }

  // handle indirection
  if (e) {
    const char* url = e->Attribute("url");
    if (url) {
      string id = url + 1;
      e = uri_find(id);
    }
  }

  return e;
}